

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.h
# Opt level: O1

void __thiscall xLearn::Trainer::~Trainer(Trainer *this)

{
  pointer pMVar1;
  pointer ppRVar2;
  
  pMVar1 = (this->metric_info_).
           super__Vector_base<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pMVar1 != (pointer)0x0) {
    operator_delete(pMVar1);
  }
  ppRVar2 = (this->reader_list_).
            super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppRVar2 != (pointer)0x0) {
    operator_delete(ppRVar2);
    return;
  }
  return;
}

Assistant:

~Trainer() {}